

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::gen_codes(IZDeflate *this,ct_data *tree,int max_code)

{
  long lVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort auStack_28 [4];
  ush next_code [16];
  
  lVar1 = 0;
  uVar3 = 0;
  do {
    uVar3 = (uVar3 + this->bl_count[lVar1]) * 2;
    auStack_28[lVar1 + 1] = uVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf);
  if (-1 < max_code) {
    uVar2 = 0;
    do {
      if (tree[uVar2].dl.dad != 0) {
        uVar4 = (uint)tree[uVar2].dl.dad;
        uVar5 = (uint)auStack_28[uVar4];
        auStack_28[uVar4] = auStack_28[uVar4] + 1;
        uVar4 = uVar4 + 1;
        uVar6 = 0;
        do {
          uVar7 = uVar6 | uVar5 & 1;
          uVar5 = uVar5 >> 1;
          uVar6 = uVar7 * 2;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        tree[uVar2].fc.freq = (ush)uVar7;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != max_code + 1);
  }
  return;
}

Assistant:

void IZDeflate::gen_codes (ct_data near *tree, int max_code)
    // ct_data near *tree;        /* the tree to decorate */
    // int max_code;              /* largest code with non zero frequency */
{
    ush next_code[MAX_BITS+1]; /* next code value for each bit length */
    ush code = 0;              /* running code value */
    int bits;                  /* bit index */
    int n;                     /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        next_code[bits] = code = (ush)((code + bl_count[bits-1]) << 1);
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert(code + bl_count[MAX_BITS]-1 == (1<< ((ush) MAX_BITS)) - 1,
            "inconsistent bit counts");
    Tracev((stderr,"\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0) continue;
        /* Now reverse the bits */
        tree[n].Code = (ush)bi_reverse(next_code[len]++, len);

        Tracec(tree != static_ltree, (stderr,"\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}